

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O2

type __thiscall
chrono::ChClassRegistration<chrono::geometry::ChBox>::_archive_in_create<chrono::geometry::ChBox>
          (ChClassRegistration<chrono::geometry::ChBox> *this,ChArchiveIn *marchive)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  
  puVar4 = (undefined8 *)::operator_new(0x20);
  uVar3 = DAT_011dd3e8;
  uVar2 = DAT_011dd3e0;
  uVar1 = VNULL;
  *puVar4 = &PTR__ChGeometry_011892b8;
  puVar4[1] = uVar1;
  puVar4[2] = uVar2;
  puVar4[3] = uVar3;
  return puVar4;
}

Assistant:

typename enable_if< !ChDetect_ArchiveINconstructor<Tc>::value, void* >::type 
    _archive_in_create(ChArchiveIn& marchive) {
        return reinterpret_cast<void*>(new Tc);
    }